

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzerResults.cpp
# Opt level: O2

void __thiscall
EnrichableI2cAnalyzerResults::GenerateBubbleText
          (EnrichableI2cAnalyzerResults *this,U64 frame_index,Channel *param_2,
          DisplayBase display_base)

{
  pointer *ppbVar1;
  AddressDisplay AVar2;
  EnrichableAnalyzerSubprocess *this_00;
  bool bVar3;
  U64 packetId;
  ostream *poVar4;
  uint uVar5;
  ulonglong uVar6;
  string *bubbleText;
  pointer pbVar7;
  allocator local_441;
  char *local_440 [4];
  Frame frame;
  byte local_410;
  undefined7 uStack_40f;
  char local_400;
  byte local_3ff;
  char ack [32];
  string local_3d8;
  char number_str [128];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bubbles;
  string local_320 [368];
  stringstream outputStream;
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)&frame);
  std::__cxx11::stringstream::stringstream((stringstream *)&outputStream);
  bVar3 = EnrichableAnalyzerSubprocess::BubbleEnabled(this->mSubprocess);
  if (bVar3) {
    this_00 = this->mSubprocess;
    packetId = AnalyzerResults::GetPacketContainingFrameSequential((ulonglong)this);
    std::__cxx11::string::string((string *)&local_3d8,"sda",(allocator *)number_str);
    EnrichableAnalyzerSubprocess::EmitBubble
              (&bubbles,this_00,packetId,frame_index,&frame,&local_3d8);
    std::__cxx11::string::~string((string *)&local_3d8);
    for (pbVar7 = bubbles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar7 != bubbles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
      AnalyzerResults::AddResultString
                ((char *)this,(pbVar7->_M_dataplus)._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
                 (char *)0x0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&bubbles);
    goto LAB_0010a21d;
  }
  if ((local_3ff & 1) == 0) {
    if ((local_3ff & 2) == 0) {
      builtin_strncpy(ack,"NAK",4);
    }
    else {
      builtin_strncpy(ack,"Missing ACK/NAK",0x10);
    }
  }
  else {
    builtin_strncpy(ack,"ACK",4);
  }
  if (local_400 == '\0') {
    uVar5 = 8;
    AVar2 = this->mSettings->mAddressDisplay;
    if (AVar2 == YES_DIRECTION_8) {
      uVar6 = CONCAT71(uStack_40f,local_410);
LAB_00109d53:
      AnalyzerHelpers::GetNumberString(uVar6,display_base,uVar5,number_str,0x80);
    }
    else {
      if (AVar2 == NO_DIRECTION_8) {
        uVar6 = (ulonglong)((uint)CONCAT71(uStack_40f,local_410) & 0xfe);
        goto LAB_00109d53;
      }
      if (AVar2 == NO_DIRECTION_7) {
        uVar6 = CONCAT71(uStack_40f,local_410) >> 1;
        uVar5 = 7;
        goto LAB_00109d53;
      }
    }
    if ((local_410 & 1) == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&bubbles);
      ppbVar1 = &bubbles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      poVar4 = std::operator<<((ostream *)ppbVar1,"W[");
      poVar4 = std::operator<<(poVar4,number_str);
      std::operator<<(poVar4,"]");
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_440[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)local_440);
      std::__cxx11::string::string((string *)local_440,"",&local_441);
      std::__cxx11::stringbuf::str(local_320);
      std::__cxx11::string::~string((string *)local_440);
      poVar4 = std::operator<<((ostream *)ppbVar1,"Write [");
      poVar4 = std::operator<<(poVar4,number_str);
      std::operator<<(poVar4,"]");
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_440[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)local_440);
      std::__cxx11::string::string((string *)local_440,"",&local_441);
      std::__cxx11::stringbuf::str(local_320);
      std::__cxx11::string::~string((string *)local_440);
      poVar4 = std::operator<<((ostream *)ppbVar1,"Write [");
      poVar4 = std::operator<<(poVar4,number_str);
      poVar4 = std::operator<<(poVar4,"] + ");
      std::operator<<(poVar4,ack);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_440[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)local_440);
      std::__cxx11::string::string((string *)local_440,"",&local_441);
      std::__cxx11::stringbuf::str(local_320);
      std::__cxx11::string::~string((string *)local_440);
      poVar4 = std::operator<<((ostream *)ppbVar1,"Setup Write to [");
      poVar4 = std::operator<<(poVar4,number_str);
      poVar4 = std::operator<<(poVar4,"] + ");
      std::operator<<(poVar4,ack);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_440[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&bubbles);
      AnalyzerResults::AddResultString
                ((char *)this,"R",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      ppbVar1 = &bubbles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      poVar4 = std::operator<<((ostream *)ppbVar1,"R[");
      poVar4 = std::operator<<(poVar4,number_str);
      std::operator<<(poVar4,"]");
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_440[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)local_440);
      std::__cxx11::string::string((string *)local_440,"",&local_441);
      std::__cxx11::stringbuf::str(local_320);
      std::__cxx11::string::~string((string *)local_440);
      poVar4 = std::operator<<((ostream *)ppbVar1,"Read [");
      poVar4 = std::operator<<(poVar4,number_str);
      std::operator<<(poVar4,"]");
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_440[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)local_440);
      std::__cxx11::string::string((string *)local_440,"",&local_441);
      std::__cxx11::stringbuf::str(local_320);
      std::__cxx11::string::~string((string *)local_440);
      poVar4 = std::operator<<((ostream *)ppbVar1,"Read [");
      poVar4 = std::operator<<(poVar4,number_str);
      poVar4 = std::operator<<(poVar4,"] + ");
      std::operator<<(poVar4,ack);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_440[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)local_440);
      std::__cxx11::string::string((string *)local_440,"",&local_441);
      std::__cxx11::stringbuf::str(local_320);
      std::__cxx11::string::~string((string *)local_440);
      poVar4 = std::operator<<((ostream *)ppbVar1,"Setup Read to [");
      poVar4 = std::operator<<(poVar4,number_str);
      poVar4 = std::operator<<(poVar4,"] + ");
      std::operator<<(poVar4,ack);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_440[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
  }
  else {
    AnalyzerHelpers::GetNumberString(CONCAT71(uStack_40f,local_410),display_base,8,number_str,0x80);
    AnalyzerResults::AddResultString
              ((char *)this,number_str,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::stringstream::stringstream((stringstream *)&bubbles);
    poVar4 = std::operator<<((ostream *)
                             &bubbles.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,number_str);
    poVar4 = std::operator<<(poVar4," + ");
    std::operator<<(poVar4,ack);
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddResultString
              ((char *)this,local_440[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  std::__cxx11::string::~string((string *)local_440);
  std::__cxx11::stringstream::~stringstream((stringstream *)&bubbles);
LAB_0010a21d:
  std::__cxx11::stringstream::~stringstream((stringstream *)&outputStream);
  Frame::~Frame(&frame);
  return;
}

Assistant:

void EnrichableI2cAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& /*channel*/, DisplayBase display_base )  //unrefereced vars commented out to remove warnings.
{
	//we only need to pay attention to 'channel' if we're making bubbles for more than one channel (as set by AddChannelBubblesWillAppearOn)
	ClearResultStrings();
	Frame frame = GetFrame( frame_index );
	std::stringstream outputStream;

	if(mSubprocess->BubbleEnabled()) {
		std::vector<std::string> bubbles = mSubprocess->EmitBubble(
			GetPacketContainingFrameSequential(frame_index),
			frame_index,
			frame,
			"sda"
		);
		for(const std::string& bubbleText: bubbles) {
			AddResultString(bubbleText.c_str());
		}
	} else {
		char ack[32];
		if( ( frame.mFlags & I2C_FLAG_ACK ) != 0 )
			snprintf( ack, sizeof(ack), "ACK" );
		else if( ( frame.mFlags & I2C_MISSING_FLAG_ACK ) != 0 )
			snprintf( ack, sizeof( ack ), "Missing ACK/NAK" );
		else
			snprintf( ack, sizeof(ack), "NAK" );

		if( frame.mType == I2cAddress )
		{
			char number_str[128];
			switch( mSettings->mAddressDisplay )
			{
			case NO_DIRECTION_7:
				AnalyzerHelpers::GetNumberString( frame.mData1 >> 1, display_base, 7, number_str, 128 );
				break;
			case NO_DIRECTION_8:
				AnalyzerHelpers::GetNumberString( frame.mData1 & 0xFE, display_base, 8, number_str, 128 );
				break;
			case YES_DIRECTION_8:
				AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );
				break;
			}

			I2cDirection direction;
			if( ( frame.mData1 & 0x1 ) != 0 )
				direction = I2C_READ;
			else
				direction = I2C_WRITE;

			if( direction == I2C_READ )
			{
				std::stringstream ss;
				AddResultString( "R" );

				ss << "R[" << number_str << "]";
				AddResultString( ss.str().c_str() );
				ss.str("");

				ss << "Read [" << number_str << "]";
				AddResultString( ss.str().c_str() );
				ss.str("");

				ss << "Read [" << number_str << "] + " << ack;
				AddResultString( ss.str().c_str() );
				ss.str("");	

				ss << "Setup Read to [" << number_str << "] + " << ack;
				AddResultString( ss.str().c_str() );
			}else
			{
				std::stringstream ss;
				ss << "W[" << number_str << "]";
				AddResultString( ss.str().c_str() );
				ss.str("");

				ss << "Write [" << number_str << "]";
				AddResultString( ss.str().c_str() );
				ss.str("");

				ss << "Write [" << number_str << "] + " << ack;
				AddResultString( ss.str().c_str() );
				ss.str("");	

				ss << "Setup Write to [" << number_str << "] + " << ack;
				AddResultString( ss.str().c_str() );
			}
		}else
		{
			char number_str[128];
			AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

			AddResultString( number_str );

			std::stringstream ss;
			ss << number_str << " + " << ack;
			AddResultString( ss.str().c_str() );
		}
	}
}